

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O3

void __thiscall CTPNIfnil::gen_code(CTPNIfnil *this,int discard,int for_condition)

{
  int iVar1;
  int iVar2;
  CTcPrsNode *pCVar3;
  CTcGenTarg *pCVar4;
  CTcCodeLabel *lbl;
  
  pCVar3 = (this->super_CTPNIfnilBase).first_;
  (**(pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(pCVar3,0,0);
  if (discard == 0) {
    CTcGenTarg::write_op(G_cg,0x88);
    pCVar4 = G_cg;
    iVar2 = G_cg->sp_depth_;
    iVar1 = iVar2 + 1;
    G_cg->sp_depth_ = iVar1;
    if (pCVar4->max_sp_depth_ <= iVar2) {
      pCVar4->max_sp_depth_ = iVar1;
    }
  }
  lbl = CTcPrsNode::gen_jump_ahead(0x9f);
  pCVar4 = G_cg;
  G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
  if (discard == 0) {
    CTcGenTarg::write_op(pCVar4,0x89);
    G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
  }
  pCVar3 = (this->super_CTPNIfnilBase).second_;
  (**(pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(pCVar3,discard,(ulong)(uint)for_condition)
  ;
  CTcPrsNode::def_label_pos(lbl);
  return;
}

Assistant:

void CTPNIfnil::gen_code(int discard, int for_condition)
{
    /* generate the first operand */
    first_->gen_code(FALSE, FALSE);

    /* check to see if we're keeping the result or merely testing it */
    if (!discard)
    {
        /* we're keep the result - make a copy for the JNOTNIL */
        G_cg->write_op(OPC_DUP);
        G_cg->note_push();
    }

    /* if it's not nil, we're done - jump to the end of the operator */
    CTcCodeLabel *lbl_end = gen_jump_ahead(OPC_JNOTNIL);
    G_cg->note_pop();

    /* 
     *   We're on the 'nil' branch now, meaning we're not going to yield the
     *   first value after all.  If we're yielding anything, discard the
     *   extra yielding copy we made of the first value. 
     */
    if (!discard)
    {
        G_cg->write_op(OPC_DISC);
        G_cg->note_pop();
    }

    /* generate the 'nil' branch, yielding the second operand */
    second_->gen_code(discard, for_condition);

    /* this is the end of the test - generate the end label */
    def_label_pos(lbl_end);
}